

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

bool __thiscall Js::JavascriptArray::BigIndex::operator>(BigIndex *this,BigIndex *rhs)

{
  uint32 uVar1;
  uint32 uVar2;
  uint64 uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  if (rhs->index == 0xffffffff) {
    if (this->index != 0xffffffff) {
      uVar1 = GetSmallIndex(this);
      uVar3 = GetBigIndex(rhs);
      return uVar3 < uVar1;
    }
    uVar3 = GetBigIndex(this);
    uVar4 = GetBigIndex(rhs);
  }
  else {
    if (this->index != 0xffffffff) {
      uVar1 = GetSmallIndex(this);
      uVar2 = GetSmallIndex(rhs);
      bVar5 = uVar1 < uVar2;
      bVar6 = uVar1 == uVar2;
      goto LAB_00a4abd5;
    }
    uVar3 = GetBigIndex(this);
    uVar1 = GetSmallIndex(rhs);
    uVar4 = (ulong)uVar1;
  }
  bVar5 = uVar3 < uVar4;
  bVar6 = uVar3 == uVar4;
LAB_00a4abd5:
  return !bVar5 && !bVar6;
}

Assistant:

bool JavascriptArray::BigIndex::operator> (const BigIndex& rhs) const
    {
        if (rhs.IsSmallIndex() && this->IsSmallIndex())
        {
            return this->GetSmallIndex() > rhs.GetSmallIndex();
        }
        else if (rhs.IsSmallIndex() && !this->IsSmallIndex())
        {
            // if lhs is big promote rhs
            return this->GetBigIndex() > (uint64)rhs.GetSmallIndex();
        }
        else if (!rhs.IsSmallIndex() && this->IsSmallIndex())
        {
            // if rhs is big promote lhs
            return ((uint64)this->GetSmallIndex()) > rhs.GetBigIndex();
        }
        return this->GetBigIndex() > rhs.GetBigIndex();
    }